

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::ContextArrayPack::ContextArrayPack
          (ContextArrayPack *this,RenderContext *renderCtx,Context *drawContext)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int *piVar3;
  undefined4 extraout_var_00;
  int local_3c [5];
  int local_28 [2];
  Context *local_20;
  Context *drawContext_local;
  RenderContext *renderCtx_local;
  ContextArrayPack *this_local;
  
  this->_vptr_ContextArrayPack = (_func_int **)&PTR__ContextArrayPack_032e6b08;
  this->m_renderCtx = renderCtx;
  this->m_ctx = drawContext;
  local_20 = drawContext;
  drawContext_local = (Context *)renderCtx;
  renderCtx_local = (RenderContext *)this;
  std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::vector
            (&this->m_arrays);
  this->m_program = (ShaderProgram *)0x0;
  local_28[1] = 0x200;
  iVar1 = (*drawContext_local->_vptr_Context[4])();
  local_28[0] = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  piVar3 = std::min<int>(local_28 + 1,local_28);
  iVar1 = *piVar3;
  local_3c[1] = 0x200;
  iVar2 = (*drawContext_local->_vptr_Context[4])();
  local_3c[0] = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar2));
  piVar3 = std::min<int>(local_3c + 1,local_3c);
  tcu::Surface::Surface(&this->m_screen,iVar1,*piVar3);
  return;
}

Assistant:

ContextArrayPack::ContextArrayPack (glu::RenderContext& renderCtx, sglr::Context& drawContext)
	: m_renderCtx	(renderCtx)
	, m_ctx			(drawContext)
	, m_program		(DE_NULL)
	, m_screen		(std::min(512, renderCtx.getRenderTarget().getWidth()), std::min(512, renderCtx.getRenderTarget().getHeight()))
{
}